

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetoh.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__stream;
  FILE *__stream_00;
  undefined8 *in_RSI;
  int in_EDI;
  int c;
  FILE *out;
  FILE *in;
  int local_4;
  
  if (in_EDI == 4) {
    __stream = fopen((char *)in_RSI[2],"r");
    if (__stream == (FILE *)0x0) {
      perror("could not open input file");
      local_4 = 1;
    }
    else {
      __stream_00 = fopen((char *)in_RSI[3],"w");
      if (__stream_00 == (FILE *)0x0) {
        perror("could not open output file");
        local_4 = 1;
      }
      else {
        fprintf(__stream_00,"static char %s[] = {\n",in_RSI[1]);
        while( true ) {
          uVar1 = fgetc(__stream);
          if (uVar1 == 0xffffffff) break;
          fprintf(__stream_00,"%hhi,",(ulong)uVar1);
        }
        fprintf(__stream_00,"0\n};\n");
        fclose(__stream);
        fclose(__stream_00);
        local_4 = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"Usage: %s <resource_name> <infile> <outfile.h>\n",*in_RSI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
	if(argc != 4) {
		fprintf(stderr, "Usage: %s <resource_name> <infile> <outfile.h>\n", argv[0]);
		return 1;
	}

	FILE *in, *out;
	int c;

	in = fopen(argv[2], "r");
	if(in == NULL) {
		perror("could not open input file");
		return 1;
	}

	out = fopen(argv[3], "w");
	if(out == NULL) {
		perror("could not open output file");
		return 1;
	}

	fprintf(out, "static char %s[] = {\n", argv[1]);

	while((c = fgetc(in)) != EOF) {
		fprintf(out, "%hhi,", c);
	}

	fprintf(out, "0\n};\n");
	fclose(in);
	fclose(out);
	return 0;
}